

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  rule **pprVar2;
  long lVar3;
  char *__s;
  symbol **ppsVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  char *__dest;
  ushort **ppuVar9;
  rule *prVar10;
  rule *prVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  lemon local_228;
  undefined8 local_128 [33];
  
  OptInit(argv,main::options,(FILE *)_stderr);
  if (main::version != 0) {
    puts("Lemon version 1.0");
    local_228.errorcnt = 0;
LAB_0010574f:
    exit(local_228.errorcnt);
  }
  iVar5 = OptNArgs();
  if (iVar5 == 1) {
    pcVar14 = (char *)0x0;
    memset(&local_228,0,0x100);
    Strsafe_init();
    Symbol_init();
    State_init();
    local_228.argv0 = *argv;
    uVar6 = argindex(0);
    __s = output_dir;
    if (-1 < (int)uVar6) {
      pcVar14 = ::argv[uVar6];
    }
    __dest = pcVar14;
    local_228.filename = pcVar14;
    if (output_dir != (char *)0x0) {
      sVar7 = strlen(pcVar14);
      sVar8 = sVar7;
      if (pcVar14 + (sVar7 - 1) < pcVar14) {
        pcVar14 = (char *)0x0;
      }
      else {
        do {
          if (sVar8 == 1) goto LAB_00105792;
          sVar1 = sVar8 - 1;
          lVar13 = sVar8 - 2;
          sVar8 = sVar1;
        } while (pcVar14[lVar13] != '/');
        pcVar14 = pcVar14 + sVar1;
      }
LAB_00105792:
      sVar8 = strlen(__s);
      __dest = (char *)malloc((long)((int)sVar8 + (int)sVar7 + 1));
      if (__dest == (char *)0x0) {
        pcVar14 = "Out of memory.  Aborting...\n";
        sVar8 = 0x1c;
        goto LAB_00105764;
      }
      strcpy(__dest,__s);
      strcat(__dest,pcVar14);
    }
    local_228.basisflag = main::basisflag;
    local_228.nolinenosflag = main::nolinenosflag;
    local_228.outbasefilename = __dest;
    Symbol_new("$");
    local_228.errsym = Symbol_new("error");
    (local_228.errsym)->useCnt = 0;
    Parse(&local_228);
    if (local_228.errorcnt != 0) goto LAB_0010574f;
    if (local_228.nrule != 0) {
      Symbol_new("{default}");
      local_228.nsymbol = 0;
      if (x2a != (s_x2 *)0x0) {
        local_228.nsymbol = x2a->count;
      }
      local_228.symbols = Symbol_arrayof();
      sVar8 = (size_t)local_228.nsymbol;
      if (0 < (long)sVar8) {
        sVar7 = 0;
        do {
          local_228.symbols[sVar7]->index = (int)sVar7;
          sVar7 = sVar7 + 1;
        } while (sVar8 != sVar7);
      }
      qsort(local_228.symbols,sVar8,8,Symbolcmpp);
      ppsVar4 = local_228.symbols;
      if ((long)local_228.nsymbol < 1) {
        lVar13 = 0;
      }
      else {
        lVar13 = 0;
        do {
          local_228.symbols[lVar13]->index = (int)lVar13;
          lVar13 = lVar13 + 1;
        } while (local_228.nsymbol != lVar13);
      }
      do {
        lVar3 = lVar13 + -1;
        lVar13 = lVar13 + -1;
      } while (local_228.symbols[lVar3]->type == MULTITERMINAL);
      iVar5 = strcmp(local_228.symbols[lVar3]->name,"{default}");
      if (iVar5 != 0) {
        __assert_fail("strcmp(lem.symbols[i-1]->name,\"{default}\")==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                      ,0x661,"int main(int, char **)");
      }
      local_228.nsymbol = (int)lVar13;
      ppuVar9 = __ctype_b_loc();
      lVar13 = 0;
      do {
        lVar3 = lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while ((*(byte *)((long)*ppuVar9 + (ulong)(byte)*ppsVar4[lVar3]->name * 2 + 1) & 1) != 0);
      local_228.nterminal = (int)lVar13;
      uVar6 = 0;
      prVar10 = local_228.rule;
      if (local_228.rule != (rule *)0x0) {
        prVar11 = local_228.rule;
        uVar12 = 0;
        do {
          pprVar2 = &prVar11->next;
          uVar6 = (uVar12 + 1) - (uint)(prVar11->code == (char *)0x0);
          prVar11->iRule = -(uint)(prVar11->code == (char *)0x0) | uVar12;
          prVar11 = *pprVar2;
          uVar12 = uVar6;
        } while (*pprVar2 != (rule *)0x0);
      }
      for (; prVar10 != (rule *)0x0; prVar10 = prVar10->next) {
        if (prVar10->iRule < 0) {
          prVar10->iRule = uVar6;
          uVar6 = uVar6 + 1;
        }
      }
      local_228.startRule = local_228.rule;
      memset(local_128,0,0x100);
      prVar10 = local_228.rule;
      do {
        if (prVar10 == (rule *)0x0) {
          lVar13 = 0;
          prVar10 = (rule *)0x0;
          do {
            prVar10 = Rule_merge((rule *)local_128[lVar13],prVar10);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x20);
          local_228.rule = prVar10;
          if (main::rpflag == 0) {
            size = local_228.nterminal + 2;
            FindRulePrecedences(&local_228);
            FindFirstSets(&local_228);
            local_228.nstate = 0;
            FindStates(&local_228);
            local_228.sorted = State_arrayof();
            FindLinks(&local_228);
            FindFollowSets(&local_228);
            FindActions(&local_228);
            if (main::compress == 0) {
              CompressTables(&local_228);
            }
            if (main::noResort == 0) {
              ResortStates(&local_228);
            }
            if (main::quiet == 0) {
              ReportOutput(&local_228);
            }
            ReportTable(&local_228,main::mhflag);
            if (main::mhflag == 0) {
              ReportHeader(&local_228);
            }
          }
          else {
            Reprint(&local_228);
          }
          if (main::statistics != 0) {
            puts("Parser statistics:");
            stats_line("terminal symbols",local_228.nterminal);
            stats_line("non-terminal symbols",local_228.nsymbol - local_228.nterminal);
            stats_line("total symbols",local_228.nsymbol);
            stats_line("rules",local_228.nrule);
            stats_line("states",local_228.nxstate);
            stats_line("conflicts",local_228.nconflict);
            stats_line("action table entries",local_228.nactiontab);
            stats_line("total table size (bytes)",local_228.tablesize);
          }
          if (local_228.nconflict != 0) {
            fprintf(_stderr,"%d parsing conflicts.\n");
          }
          exit(local_228.nconflict + local_228.errorcnt);
        }
        prVar11 = prVar10->next;
        prVar10->next = (rule *)0x0;
        lVar13 = 0;
        do {
          if ((rule *)local_128[lVar13] == (rule *)0x0) goto LAB_001059d8;
          prVar10 = Rule_merge((rule *)local_128[lVar13],prVar10);
          local_128[lVar13] = 0;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x20);
        lVar13 = 0x20;
LAB_001059d8:
        local_128[lVar13] = prVar10;
        prVar10 = prVar11;
      } while( true );
    }
    pcVar14 = "Empty grammar.\n";
    sVar8 = 0xf;
  }
  else {
    pcVar14 = "Exactly one filename argument is required.\n";
    sVar8 = 0x2b;
  }
LAB_00105764:
  fwrite(pcVar14,sVar8,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
  static int version = 0;
  static int rpflag = 0;
  static int basisflag = 0;
  static int compress = 0;
  static int quiet = 0;
  static int statistics = 0;
  static int mhflag = 0;
  static int nolinenosflag = 0;
  static int noResort = 0;
  static struct s_options options[] = {
    {OPT_FLAG, "b", (char*)&basisflag, "Print only the basis in report."},
    {OPT_FLAG, "c", (char*)&compress, "Don't compress the action table."},
    {OPT_FSTR, "C", (char*)handle_C_option, "Write output files to a different directory."},
    {OPT_FSTR, "D", (char*)handle_D_option, "Define an %ifdef macro."},
    {OPT_FSTR, "f", 0, "Ignored.  (Placeholder for -f compiler options.)"},
    {OPT_FLAG, "g", (char*)&rpflag, "Print grammar without actions."},
    {OPT_FSTR, "I", 0, "Ignored.  (Placeholder for '-I' compiler options.)"},
    {OPT_FLAG, "m", (char*)&mhflag, "Output a makeheaders compatible file."},
    {OPT_FLAG, "l", (char*)&nolinenosflag, "Do not print #line statements."},
    {OPT_FSTR, "O", 0, "Ignored.  (Placeholder for '-O' compiler options.)"},
    {OPT_FLAG, "p", (char*)&showPrecedenceConflict,
                    "Show conflicts resolved by precedence rules"},
    {OPT_FLAG, "q", (char*)&quiet, "(Quiet) Don't print the report file."},
    {OPT_FLAG, "r", (char*)&noResort, "Do not sort or renumber states"},
    {OPT_FLAG, "s", (char*)&statistics,
                                   "Print parser stats to standard output."},
    {OPT_FLAG, "x", (char*)&version, "Print the version number."},
    {OPT_FSTR, "T", (char*)handle_T_option, "Specify a template file."},
    {OPT_FSTR, "W", 0, "Ignored.  (Placeholder for '-W' compiler options.)"},
    {OPT_FLAG,0,0,0}
  };
  int i;
  struct lemon lem;
  struct rule *rp;

  OptInit(argv,options,stderr);
  if( version ){
     printf("Lemon version 1.0\n");
     exit(0); 
  }
  if( OptNArgs()!=1 ){
    fprintf(stderr,"Exactly one filename argument is required.\n");
    exit(1);
  }
  memset(&lem, 0, sizeof(lem));
  lem.errorcnt = 0;

  /* Initialize the machine */
  Strsafe_init();
  Symbol_init();
  State_init();
  lem.argv0 = argv[0];
  lem.filename = OptArg(0);
  lem.outbasefilename = stitch_outdir(lem.filename);
  lem.basisflag = basisflag;
  lem.nolinenosflag = nolinenosflag;
  Symbol_new("$");
  lem.errsym = Symbol_new("error");
  lem.errsym->useCnt = 0;

  /* Parse the input file */
  Parse(&lem);
  if( lem.errorcnt ) exit(lem.errorcnt);
  if( lem.nrule==0 ){
    fprintf(stderr,"Empty grammar.\n");
    exit(1);
  }

  /* Count and index the symbols of the grammar */
  Symbol_new("{default}");
  lem.nsymbol = Symbol_count();
  lem.symbols = Symbol_arrayof();
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  qsort(lem.symbols,lem.nsymbol,sizeof(struct symbol*), Symbolcmpp);
  for(i=0; i<lem.nsymbol; i++) lem.symbols[i]->index = i;
  while( lem.symbols[i-1]->type==MULTITERMINAL ){ i--; }
  assert( strcmp(lem.symbols[i-1]->name,"{default}")==0 );
  lem.nsymbol = i - 1;
  for(i=1; ISUPPER(lem.symbols[i]->name[0]); i++);
  lem.nterminal = i;

  /* Assign sequential rule numbers.  Start with 0.  Put rules that have no
  ** reduce action C-code associated with them last, so that the switch()
  ** statement that selects reduction actions will have a smaller jump table.
  */
  for(i=0, rp=lem.rule; rp; rp=rp->next){
    rp->iRule = rp->code ? i++ : -1;
  }
  for(rp=lem.rule; rp; rp=rp->next){
    if( rp->iRule<0 ) rp->iRule = i++;
  }
  lem.startRule = lem.rule;
  lem.rule = Rule_sort(lem.rule);

  /* Generate a reprint of the grammar, if requested on the command line */
  if( rpflag ){
    Reprint(&lem);
  }else{
    /* Initialize the size for all follow and first sets */
    SetSize(lem.nterminal+1);

    /* Find the precedence for every production rule (that has one) */
    FindRulePrecedences(&lem);

    /* Compute the lambda-nonterminals and the first-sets for every
    ** nonterminal */
    FindFirstSets(&lem);

    /* Compute all LR(0) states.  Also record follow-set propagation
    ** links so that the follow-set can be computed later */
    lem.nstate = 0;
    FindStates(&lem);
    lem.sorted = State_arrayof();

    /* Tie up loose ends on the propagation links */
    FindLinks(&lem);

    /* Compute the follow set of every reducible configuration */
    FindFollowSets(&lem);

    /* Compute the action tables */
    FindActions(&lem);

    /* Compress the action tables */
    if( compress==0 ) CompressTables(&lem);

    /* Reorder and renumber the states so that states with fewer choices
    ** occur at the end.  This is an optimization that helps make the
    ** generated parser tables smaller. */
    if( noResort==0 ) ResortStates(&lem);

    /* Generate a report of the parser generated.  (the "y.output" file) */
    if( !quiet ) ReportOutput(&lem);

    /* Generate the source code for the parser */
    ReportTable(&lem, mhflag);

    /* Produce a header file for use by the scanner.  (This step is
    ** omitted if the "-m" option is used because makeheaders will
    ** generate the file for us.) */
    if( !mhflag ) ReportHeader(&lem);
  }
  if( statistics ){
    printf("Parser statistics:\n");
    stats_line("terminal symbols", lem.nterminal);
    stats_line("non-terminal symbols", lem.nsymbol - lem.nterminal);
    stats_line("total symbols", lem.nsymbol);
    stats_line("rules", lem.nrule);
    stats_line("states", lem.nxstate);
    stats_line("conflicts", lem.nconflict);
    stats_line("action table entries", lem.nactiontab);
    stats_line("total table size (bytes)", lem.tablesize);
  }
  if( lem.nconflict ){
    fprintf(stderr,"%d parsing conflicts.\n",lem.nconflict);
  }
  exit(lem.errorcnt + lem.nconflict);
  return (lem.errorcnt + lem.nconflict);
}